

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::UseProgStagesCase::iterate(UseProgStagesCase *this)

{
  code *pcVar1;
  GLuint GVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLuint GVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  MessageBuilder *this_00;
  TestError *pTVar8;
  char *pcVar9;
  GLSLVersion glslVersion;
  GLSLVersion glslVersion_00;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  ProgramSources local_610;
  undefined1 local_540 [8];
  ShaderProgram progNoLink;
  string local_468 [4];
  uint pos;
  string fragNoMain;
  string local_440;
  allocator<char> local_419;
  string local_418;
  ProgramSources local_3f8;
  undefined1 local_328 [8];
  ShaderProgram progVF;
  string local_d8;
  string local_a8;
  int local_84;
  string local_80 [4];
  GLint linkStatus;
  string frag;
  string vtx;
  char *shaderSrc [1];
  GLuint programFrag;
  GLuint programVtx;
  GLuint progIdF;
  GLuint progIdV;
  GLuint pipeline;
  GLenum err;
  Functions *gl;
  TestLog *log;
  UseProgStagesCase *this_local;
  
  log = (TestLog *)this;
  gl = (Functions *)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  _pipeline = CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::string((string *)(frag.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_80);
  generateBasicVertexSrc_abi_cxx11_(&local_a8,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::operator=((string *)(frag.field_2._M_local_buf + 8),(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  generateBasicFragmentSrc_abi_cxx11_(&local_d8,(glcts *)(ulong)this->m_glslVersion,glslVersion_00);
  std::__cxx11::string::operator=(local_80,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&progVF.m_program.m_info.linkTimeUs,(TestLog *)gl,
             (BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&progVF.m_program.m_info.linkTimeUs,
                       (char (*) [32])"Begin:UseProgStagesCase iterate");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&progVF.m_program.m_info.linkTimeUs);
  (**(code **)(_pipeline + 0x6d8))(1,&progIdF);
  (**(code **)(_pipeline + 0x98))(progIdF);
  vtx.field_2._8_8_ = std::__cxx11::string::c_str();
  GVar4 = (**(code **)(_pipeline + 0x3f8))(0x8b31,1,(undefined1 *)((long)&vtx.field_2 + 8));
  (**(code **)(_pipeline + 0x1688))(progIdF,1,GVar4);
  (**(code **)(_pipeline + 0x9a0))(progIdF,0x8b31,&programVtx);
  (**(code **)(_pipeline + 0x9a0))(progIdF,0x8b30,&programFrag);
  if (((GVar4 == 0) || (programVtx != GVar4)) || (programFrag != 0)) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x2cd);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar5 = (**(code **)(_pipeline + 0x800))();
  glu::checkError(dVar5,"UseProgramStages failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x2cf);
  vtx.field_2._8_8_ = std::__cxx11::string::c_str();
  GVar6 = (**(code **)(_pipeline + 0x3f8))(0x8b30,1,(undefined1 *)((long)&vtx.field_2 + 8));
  (**(code **)(_pipeline + 0x1688))(progIdF,2,GVar6);
  (**(code **)(_pipeline + 0x9a0))(progIdF,0x8b30,&programFrag);
  if (((GVar6 == 0) || (programFrag != GVar6)) || (programFrag == programVtx)) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x2d9);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_pipeline + 0x1688))(progIdF,3,0);
  (**(code **)(_pipeline + 0x9a0))(progIdF,0x8b31,&programVtx);
  (**(code **)(_pipeline + 0x9a0))(progIdF,0x8b30,&programFrag);
  if ((programVtx != 0) || (programFrag != 0)) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x2e2);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,pcVar9,&local_419);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,pcVar9,(allocator<char> *)(fragNoMain.field_2._M_local_buf + 0xf))
  ;
  glu::makeVtxFragSources(&local_3f8,&local_418,&local_440);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_328,pRVar7,&local_3f8);
  glu::ProgramSources::~ProgramSources(&local_3f8);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)(fragNoMain.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  pcVar1 = *(code **)(_pipeline + 0x1058);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_328);
  (*pcVar1)(dVar5,0x8258,1);
  pcVar1 = *(code **)(_pipeline + 0xce8);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_328);
  (*pcVar1)(dVar5);
  pcVar1 = *(code **)(_pipeline + 0x9d8);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_328);
  (*pcVar1)(dVar5,0x8b82,&local_84);
  if (local_84 != 1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x2ee);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar5 = (**(code **)(_pipeline + 0x800))();
  glu::checkError(dVar5,"UseProgramStages failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x2f0);
  GVar2 = progIdF;
  pcVar1 = *(code **)(_pipeline + 0x1688);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_328);
  (*pcVar1)(GVar2,3,dVar5);
  (**(code **)(_pipeline + 0x9a0))(progIdF,0x8b31,&programVtx);
  (**(code **)(_pipeline + 0x9a0))(progIdF,0x8b30,&programFrag);
  GVar2 = programVtx;
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_328);
  if ((GVar2 != dVar5) || (programVtx != programFrag)) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x2f7);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar5 = (**(code **)(_pipeline + 0x800))();
  glu::checkError(dVar5,"UseProgramStages failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x2f9);
  (**(code **)(_pipeline + 0x1688))(progIdF,3,0);
  (**(code **)(_pipeline + 0x1688))(progIdF,1,GVar6);
  dVar5 = (**(code **)(_pipeline + 0x800))();
  glu::checkError(dVar5,"UseProgramStages failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x2fe);
  (**(code **)(_pipeline + 0x98))(0);
  (**(code **)(_pipeline + 0x450))(1,&progIdF);
  progIdF = 0;
  (**(code **)(_pipeline + 0x6d8))(1,&progIdF);
  (**(code **)(_pipeline + 0x1688))(progIdF,1,GVar4);
  (**(code **)(_pipeline + 0x1688))(progIdF,2,GVar6);
  (**(code **)(_pipeline + 0x9a0))(progIdF,0x8b31,&programVtx);
  (**(code **)(_pipeline + 0x9a0))(progIdF,0x8b30,&programFrag);
  if ((programVtx != GVar4) || (programFrag != GVar6)) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x30b);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar5 = (**(code **)(_pipeline + 0x800))();
  glu::checkError(dVar5,"UseProgramStages failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x30d);
  (**(code **)(_pipeline + 0x1688))(progIdF,0xfffffffc,GVar4);
  progIdV = (**(code **)(_pipeline + 0x800))();
  if (progIdV != 0x501) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x316);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(_pipeline + 0x1058);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_328);
  (*pcVar1)(dVar5,0x8258,0);
  pcVar1 = *(code **)(_pipeline + 0xce8);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_328);
  (*pcVar1)(dVar5);
  pcVar1 = *(code **)(_pipeline + 0x9d8);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_328);
  (*pcVar1)(dVar5,0x8b82,&local_84);
  if (local_84 != 1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,799);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar5 = (**(code **)(_pipeline + 0x800))();
  glu::checkError(dVar5,"UseProgramStages failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x321);
  GVar2 = progIdF;
  pcVar1 = *(code **)(_pipeline + 0x1688);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_328);
  (*pcVar1)(GVar2,3,dVar5);
  progIdV = (**(code **)(_pipeline + 0x800))();
  if (progIdV != 0x502) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x326);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::string(local_468,local_80);
  progNoLink.m_program.m_info.linkTimeUs._4_4_ =
       std::__cxx11::string::find((char *)local_468,0x2a988e8);
  std::__cxx11::string::replace
            ((ulong)local_468,(ulong)progNoLink.m_program.m_info.linkTimeUs._4_4_,&DAT_00000004);
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,pcVar9,&local_631);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,pcVar9,&local_659);
  glu::makeVtxFragSources(&local_610,&local_630,&local_658);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_540,pRVar7,&local_610);
  glu::ProgramSources::~ProgramSources(&local_610);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  pcVar1 = *(code **)(_pipeline + 0x1058);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_540);
  (*pcVar1)(dVar5,0x8258,1);
  pcVar1 = *(code **)(_pipeline + 0xce8);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_540);
  (*pcVar1)(dVar5);
  GVar2 = progIdF;
  pcVar1 = *(code **)(_pipeline + 0x1688);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_540);
  (*pcVar1)(GVar2,3,dVar5);
  progIdV = (**(code **)(_pipeline + 0x800))();
  if (progIdV != 0x502) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x337);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_pipeline + 0x1688))(progIdF + 1000,1,GVar4);
  progIdV = (**(code **)(_pipeline + 0x800))();
  if (progIdV != 0x502) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x33f);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_pipeline + 0x450))(1,&progIdF);
  (**(code **)(_pipeline + 0x1688))(progIdF,1,GVar4);
  progIdV = (**(code **)(_pipeline + 0x800))();
  if (progIdV != 0x502) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"UseProgramStages failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x348);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_pipeline + 0x448))(GVar4);
  (**(code **)(_pipeline + 0x448))(GVar6);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_540);
  std::__cxx11::string::~string(local_468);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_328);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)(frag.field_2._M_local_buf + 8));
  return STOP;
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		glw::GLenum			  err;
		glw::GLuint			  pipeline;
		glw::GLuint			  progIdV, progIdF;
		glw::GLuint			  programVtx, programFrag;
		const char*			  shaderSrc[1];
		std::string			  vtx;
		std::string			  frag;
		glw::GLint			  linkStatus;

		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		// UseProgramStages verification
		log << TestLog::Message << "Begin:UseProgStagesCase iterate" << TestLog::EndMessage;

		gl.genProgramPipelines(1, &pipeline);
		gl.bindProgramPipeline(pipeline);

		// Use Vertex Shader
		shaderSrc[0] = vtx.c_str();
		programVtx   = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, shaderSrc);

		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programVtx);
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((programVtx == 0) || (progIdV != programVtx) || (progIdF != 0))
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Use Fragment Shader
		shaderSrc[0] = frag.c_str();
		programFrag  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, shaderSrc);

		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programFrag);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((programFrag == 0) || (progIdF != programFrag) || (progIdF == progIdV))
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Reset stages
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, 0);
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((progIdV != 0) || (progIdF != 0))
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// One program for both.
		glu::ShaderProgram progVF(m_context.getRenderContext(), glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

		// Make separable and relink
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progVF.getProgram());
		gl.getProgramiv(progVF.getProgram(), GL_LINK_STATUS, &linkStatus);
		if (linkStatus != 1)
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progVF.getProgram());
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((progIdV != progVF.getProgram()) || (progIdV != progIdF))
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Use a fragment program with vertex bit
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, 0);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programFrag);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Unbound pipeline
		gl.bindProgramPipeline(0);
		gl.deleteProgramPipelines(1, &pipeline);
		pipeline = 0;
		gl.genProgramPipelines(1, &pipeline);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programVtx);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programFrag);
		gl.getProgramPipelineiv(pipeline, GL_VERTEX_SHADER, (glw::GLint*)&progIdV);
		gl.getProgramPipelineiv(pipeline, GL_FRAGMENT_SHADER, (glw::GLint*)&progIdF);
		if ((progIdV != programVtx) || (progIdF != programFrag))
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");

		// Negative Cases

		// Invalid stages
		gl.useProgramStages(pipeline, GL_ALL_SHADER_BITS ^ (GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT), programVtx);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Program that is not separable
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_FALSE);
		gl.linkProgram(progVF.getProgram());
		gl.getProgramiv(progVF.getProgram(), GL_LINK_STATUS, &linkStatus);
		if (linkStatus != 1)
		{
			TCU_FAIL("UseProgramStages failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failed");
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progVF.getProgram());
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Program that is not successfully linked
		// remove the main keyword
		std::string  fragNoMain = frag;
		unsigned int pos		= (unsigned int)fragNoMain.find("main");
		fragNoMain.replace(pos, 4, "niaM");
		glu::ShaderProgram progNoLink(m_context.getRenderContext(),
									  glu::makeVtxFragSources(vtx.c_str(), fragNoMain.c_str()));

		gl.programParameteri(progNoLink.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progNoLink.getProgram());
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progNoLink.getProgram());
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Invalid pipeline
		gl.useProgramStages(pipeline + 1000, GL_VERTEX_SHADER_BIT, programVtx);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		// Invalid pipeline
		gl.deleteProgramPipelines(1, &pipeline);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programVtx);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("UseProgramStages failed");
		}

		gl.deleteProgram(programVtx);
		gl.deleteProgram(programFrag);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}